

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_RegVm.cpp
# Opt level: O1

bool __thiscall ExecutorRegVm::AddBreakpoint(ExecutorRegVm *this,uint instruction,bool oneHit)

{
  FastVector<RegVmCmd,_false,_false> *this_00;
  uint newSize;
  uint uVar1;
  RegVmCmd in_RAX;
  RegVmCmd *pRVar2;
  char *src;
  char *dst;
  RegVmCmd local_38;
  
  if (instruction < (this->exLinker->exRegVmCode).count) {
    pRVar2 = (this->exLinker->exRegVmCode).data;
    if (pRVar2[instruction].code != '\0') {
      this_00 = &this->breakCode;
      newSize = (this->breakCode).count;
      pRVar2 = pRVar2 + instruction;
      uVar1 = (this->breakCode).max;
      if (oneHit) {
        local_38 = in_RAX;
        if (newSize == uVar1) {
          FastVector<RegVmCmd,_false,_false>::grow_and_add(this_00,newSize,pRVar2);
        }
        else {
          (this->breakCode).count = newSize + 1;
          (this->breakCode).data[newSize] = *pRVar2;
        }
        if ((this->exLinker->exRegVmCode).count <= instruction) {
LAB_0025110f:
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x7f,
                        "T &FastVector<RegVmCmd>::operator[](unsigned int) [T = RegVmCmd, zeroNewMemory = false, skipConstructor = false]"
                       );
        }
        pRVar2 = (this->exLinker->exRegVmCode).data;
        pRVar2[instruction].code = '\0';
        pRVar2[instruction].rB = '\x02';
      }
      else {
        if (newSize == uVar1) {
          FastVector<RegVmCmd,_false,_false>::grow_and_add(this_00,newSize,pRVar2);
        }
        else {
          (this->breakCode).count = newSize + 1;
          (this->breakCode).data[newSize] = *pRVar2;
        }
        local_38.argument = instruction + 1;
        local_38.code = '\0';
        local_38.rA = '\0';
        local_38.rB = '\x01';
        local_38.rC = '\0';
        uVar1 = (this->breakCode).count;
        if (uVar1 == (this->breakCode).max) {
          FastVector<RegVmCmd,_false,_false>::grow_and_add(this_00,uVar1,&local_38);
        }
        else {
          (this->breakCode).count = uVar1 + 1;
          (this->breakCode).data[uVar1] = local_38;
        }
        if ((this->exLinker->exRegVmCode).count <= instruction) goto LAB_0025110f;
        pRVar2 = (this->exLinker->exRegVmCode).data;
        pRVar2[instruction].code = '\0';
        pRVar2[instruction].rB = '\0';
      }
      pRVar2[instruction].argument = newSize;
      return true;
    }
    dst = this->execErrorBuffer;
    src = "ERROR: cannot set breakpoint on breakpoint";
  }
  else {
    dst = this->execErrorBuffer;
    src = "ERROR: break position out of code range";
  }
  NULLC::SafeSprintf(dst,0x10000,src);
  this->execErrorMessage = this->execErrorBuffer;
  return false;
}

Assistant:

bool ExecutorRegVm::AddBreakpoint(unsigned instruction, bool oneHit)
{
	if(instruction >= exLinker->exRegVmCode.size())
	{
		NULLC::SafeSprintf(execErrorBuffer, NULLC_ERROR_BUFFER_SIZE, "ERROR: break position out of code range");
		execErrorMessage = execErrorBuffer;
		return false;
	}

	unsigned pos = breakCode.size();

	if(exLinker->exRegVmCode[instruction].code == rviNop)
	{
		NULLC::SafeSprintf(execErrorBuffer, NULLC_ERROR_BUFFER_SIZE, "ERROR: cannot set breakpoint on breakpoint");
		execErrorMessage = execErrorBuffer;
		return false;
	}

	if(oneHit)
	{
		breakCode.push_back(exLinker->exRegVmCode[instruction]);
		exLinker->exRegVmCode[instruction].code = rviNop;
		exLinker->exRegVmCode[instruction].rB = EXEC_BREAK_ONCE;
		exLinker->exRegVmCode[instruction].argument = pos;
	}
	else
	{
		breakCode.push_back(exLinker->exRegVmCode[instruction]);
		breakCode.push_back(RegVmCmd(rviNop, 0, EXEC_BREAK_RETURN, 0, instruction + 1));

		exLinker->exRegVmCode[instruction].code = rviNop;
		exLinker->exRegVmCode[instruction].rB = EXEC_BREAK_SIGNAL;
		exLinker->exRegVmCode[instruction].argument = pos;
	}
	return true;
}